

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O0

void __thiscall ByteString::ByteString(ByteString *this,uchar *bytes,size_t bytesLen)

{
  reference __dest;
  size_type in_RDX;
  vector<unsigned_char,_SecureAllocator<unsigned_char>_> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ByteString_00223738;
  std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)0x1c4584);
  std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::resize(in_RSI,in_RDX);
  if (in_RDX != 0) {
    __dest = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)(in_RDI + 1),0);
    memcpy(__dest,in_RSI,in_RDX);
  }
  return;
}

Assistant:

ByteString::ByteString(const unsigned char* bytes, const size_t bytesLen)
{
	byteString.resize(bytesLen);

	if (bytesLen > 0)
		memcpy(&byteString[0], bytes, bytesLen);
}